

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall TextField::draw(TextField *this,RenderTarget *target,RenderStates states)

{
  long in_RDI;
  RenderStates *in_stack_000000b0;
  Drawable *in_stack_000000b8;
  RenderTarget *in_stack_000000c0;
  Transform *in_stack_ffffffffffffffd8;
  Transform *left;
  
  left = (Transform *)&stack0x00000008;
  if ((*(byte *)(in_RDI + 0xb1) & 1) != 0) {
    sf::Transformable::getTransform((Transformable *)states.transform.m_matrix._8_8_);
    sf::operator*=(left,in_stack_ffffffffffffffd8);
    sf::RenderTarget::draw(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
    sf::RenderTarget::draw(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
    sf::RenderTarget::draw(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
    if (((*(byte *)(in_RDI + 0x651) & 1) != 0) && ((*(byte *)(in_RDI + 0x650) & 1) != 0)) {
      sf::RenderTarget::draw(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
    }
  }
  return;
}

Assistant:

void TextField::draw(RenderTarget& target, RenderStates states) const {
    if (visible) {
        states.transform *= getTransform();
        target.draw(label, states);
        target.draw(background, states);
        target.draw(field, states);
        if (isEditable && selected) {
            target.draw(caret, states);
        }
    }
}